

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

VulkanMock * get_vulkan_mock(void)

{
  VulkanMock local_d0;
  
  local_d0.api_version = 0x403000;
  memset(&local_d0.instance_extensions,0,0x18);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            (&local_d0.instance_extensions);
  memset(&local_d0.instance_layers,0,0x18);
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
            (&local_d0.instance_layers);
  memset(&local_d0.per_layer_instance_extension_properties,0,0x18);
  std::
  vector<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>,_std::allocator<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>_>
  ::vector(&local_d0.per_layer_instance_extension_properties);
  memset(&local_d0.per_layer_device_extension_properties,0,0x18);
  std::
  vector<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>,_std::allocator<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>_>
  ::vector(&local_d0.per_layer_device_extension_properties);
  memset(&local_d0.surface_handles,0,0x18);
  std::vector<VkSurfaceKHR_T_*,_std::allocator<VkSurfaceKHR_T_*>_>::vector
            (&local_d0.surface_handles);
  memset(&local_d0.surface_details,0,0x18);
  std::vector<VulkanMock::SurfaceDetails,_std::allocator<VulkanMock::SurfaceDetails>_>::vector
            (&local_d0.surface_details);
  memset(&local_d0.physical_device_handles,0,0x18);
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
            (&local_d0.physical_device_handles);
  memset(&local_d0.physical_devices_details,0,0x18);
  std::vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
  ::vector(&local_d0.physical_devices_details);
  VulkanMock::operator=(&mock,&local_d0);
  VulkanMock::~VulkanMock(&local_d0);
  return &mock;
}

Assistant:

VulkanMock* get_vulkan_mock() {
    mock = VulkanMock{};
    return &mock;
}